

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sphere.cpp
# Opt level: O1

bool __thiscall
ON_Sphere::ClosestPointTo(ON_Sphere *this,ON_3dPoint point,double *longitude,double *latitude)

{
  bool bVar1;
  double dVar2;
  double dVar3;
  double __y;
  double dVar4;
  ON_3dVector v;
  double local_68;
  ON_3dVector local_40;
  
  ON_3dPoint::operator-(&local_40,&point,(ON_3dPoint *)this);
  dVar2 = ON_3dVector::operator*(&local_40,&(this->plane).zaxis);
  dVar3 = ON_3dVector::operator*(&local_40,&(this->plane).xaxis);
  __y = ON_3dVector::operator*(&local_40,&(this->plane).yaxis);
  if ((((dVar3 != 0.0) || (NAN(dVar3))) || (__y != 0.0)) || (NAN(__y))) {
    local_68 = ABS(dVar3);
    if (ABS(__y) <= local_68) {
      dVar4 = (__y / dVar3) * (__y / dVar3);
    }
    else {
      dVar4 = (dVar3 / __y) * (dVar3 / __y);
      local_68 = ABS(__y);
    }
    dVar4 = dVar4 + 1.0;
    if (dVar4 < 0.0) {
      dVar4 = sqrt(dVar4);
    }
    else {
      dVar4 = SQRT(dVar4);
    }
    if (longitude != (double *)0x0) {
      dVar3 = atan2(__y,dVar3);
      dVar3 = (double)(~-(ulong)(dVar3 < 0.0) & (ulong)dVar3 |
                      (ulong)(dVar3 + 6.283185307179586) & -(ulong)(dVar3 < 0.0));
      *longitude = (double)(-(ulong)(0.0 <= dVar3) &
                           -(ulong)(dVar3 < 6.283185307179586) & (ulong)dVar3);
    }
    bVar1 = true;
    if (latitude != (double *)0x0) {
      dVar2 = atan(dVar2 / (local_68 * dVar4));
      *latitude = dVar2;
    }
  }
  else {
    if (longitude != (double *)0x0) {
      *longitude = 0.0;
    }
    if (latitude != (double *)0x0) {
      *latitude = *(double *)(&DAT_006db1d0 + (ulong)(0.0 <= dVar2) * 8);
    }
    if ((dVar2 != 0.0) || (NAN(dVar2))) {
      bVar1 = true;
    }
    else {
      bVar1 = false;
    }
  }
  return bVar1;
}

Assistant:

bool ON_Sphere::ClosestPointTo( 
       ON_3dPoint point, 
       double* longitude,
       double* latitude
       ) const
{
  bool rc = true;
  ON_3dVector v = point - plane.origin;
  double h = v*plane.zaxis;
  double x = v*plane.xaxis;
  double y = v*plane.yaxis;
  double r = 1.0;
  if ( x == 0.0 && y == 0.0 ) {
    if ( longitude )
      *longitude = 0.0;
    if ( latitude )
      *latitude = (h>=0.0) ? 0.5*ON_PI : -0.5*ON_PI;
    if ( h == 0.0 )
      rc = false;
  }
  else {
    if ( fabs(x) >= fabs(y) ) {
      r = y/x;
      r = fabs(x)*sqrt(1.0+r*r);
    }
    else {
      r = x/y;
      r = fabs(y)*sqrt(1.0+r*r);
    }
    if ( longitude ) {
      *longitude = atan2(y,x);
      if ( *longitude < 0.0 )
        *longitude += 2.0*ON_PI;
      if ( *longitude < 0.0 || *longitude >= 2.0*ON_PI)
        *longitude = 0.0;
    }
    if ( latitude )
      *latitude = atan(h/r);
  }
  return rc;
}